

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool __thiscall
cmInstallCommand::HandleFilesMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  MessageType t;
  const_iterator this_00;
  bool bVar2;
  PolicyStatus PVar3;
  const_reference pvVar4;
  ostream *poVar5;
  reference pvVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  ulong uVar7;
  size_type sVar8;
  char *pcVar9;
  reference pbVar10;
  cmInstallFilesGenerator *g;
  cmGlobalGenerator *this_02;
  PolicyID id;
  string local_bf0;
  undefined1 local_bd0 [8];
  ostringstream e_3;
  string local_a58;
  string local_a38;
  MessageType local_a14;
  undefined1 local_a10 [4];
  MessageType messageType;
  ostringstream e_2;
  char *local_898;
  char *modal;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_888;
  const_iterator fileIt;
  cmGlobalGenerator *gg;
  undefined1 local_870 [4];
  PolicyStatus status;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absFiles;
  undefined1 local_838 [8];
  ostringstream e_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filesVector;
  string local_6b0;
  undefined1 local_690 [8];
  ostringstream e;
  undefined1 local_518 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  undefined1 local_4f0 [8];
  cmCAStringVector files;
  cmInstallCommandArguments ica;
  bool programs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmInstallCommand *this_local;
  
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,0);
  ica.DefaultComponentName.field_2._M_local_buf[0xf] = std::operator==(pvVar4,"PROGRAMS");
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)&files.Ignore,&this->DefaultComponentName);
  pcVar9 = "FILES";
  if ((ica.DefaultComponentName.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar9 = "PROGRAMS";
  }
  cmCAStringVector::cmCAStringVector
            ((cmCAStringVector *)local_4f0,(cmCommandArgumentsHelper *)&files.Ignore,pcVar9,
             (cmCommandArgumentGroup *)0x0);
  cmCommandArgument::Follows((cmCommandArgument *)local_4f0,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows
            ((cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(cmCommandArgument *)local_4f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_518);
  cmInstallCommandArguments::Parse
            ((cmInstallCommandArguments *)&files.Ignore,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_518);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_518);
  if (bVar2) {
    this_01 = cmCAStringVector::GetVector_abi_cxx11_((cmCAStringVector *)local_4f0);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(this_01);
    if (bVar2) {
      this_local._7_1_ = 1;
    }
    else {
      cmInstallCommandArguments::GetRename_abi_cxx11_((cmInstallCommandArguments *)&files.Ignore);
      uVar7 = std::__cxx11::string::empty();
      if (((uVar7 & 1) == 0) &&
         (sVar8 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(this_01), 1 < sVar8)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_838);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        poVar5 = std::operator<<((ostream *)local_838,(string *)pvVar4);
        std::operator<<(poVar5," given RENAME option with more than one file.");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,
                            (string *)
                            &absFiles.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &absFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_838);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_870);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](args,0);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        bVar2 = MakeFilesFullPath(this,pcVar9,this_01,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_870);
        if (bVar2) {
          PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0062);
          fileIt._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
          local_888._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_01);
          while( true ) {
            modal = (char *)std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end(this_01);
            bVar2 = __gnu_cxx::operator!=
                              (&local_888,
                               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&modal);
            this_00 = fileIt;
            if (!bVar2) break;
            pbVar10 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_888);
            bVar2 = cmGlobalGenerator::IsExportedTargetsFile
                              ((cmGlobalGenerator *)this_00._M_current,pbVar10);
            if (bVar2) {
              local_898 = (char *)0x0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a10);
              local_a14 = AUTHOR_WARNING;
              if (PVar3 != OLD) {
                if (PVar3 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_a38,(cmPolicies *)0x3e,id);
                  poVar5 = std::operator<<((ostream *)local_a10,(string *)&local_a38);
                  std::operator<<(poVar5,"\n");
                  std::__cxx11::string::~string((string *)&local_a38);
                  local_898 = "should";
                }
                else if (PVar3 - NEW < 3) {
                  local_898 = "may";
                  local_a14 = FATAL_ERROR;
                }
              }
              if (local_898 == (char *)0x0) {
LAB_0058c80a:
                bVar2 = false;
              }
              else {
                poVar5 = std::operator<<((ostream *)local_a10,"The file\n  ");
                pbVar10 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_888);
                poVar5 = std::operator<<(poVar5,(string *)pbVar10);
                poVar5 = std::operator<<(poVar5,"\nwas generated by the export() command.  It ");
                poVar5 = std::operator<<(poVar5,local_898);
                std::operator<<(poVar5,
                                " not be installed with the install() command.  Use the install(EXPORT) mechanism instead.  See the cmake-packages(7) manual for more.\n"
                               );
                t = local_a14;
                pcVar1 = (this->super_cmCommand).Makefile;
                std::__cxx11::ostringstream::str();
                cmMakefile::IssueMessage(pcVar1,t,&local_a58);
                std::__cxx11::string::~string((string *)&local_a58);
                if (local_a14 != FATAL_ERROR) goto LAB_0058c80a;
                this_local._7_1_ = 0;
                bVar2 = true;
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a10);
              if (bVar2) goto LAB_0058ca36;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_888);
          }
          bVar2 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)&files.Ignore);
          if (bVar2) {
            cmInstallCommandArguments::GetDestination_abi_cxx11_
                      ((cmInstallCommandArguments *)&files.Ignore);
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              pcVar1 = (this->super_cmCommand).Makefile;
              g = CreateInstallFilesGenerator
                            (pcVar1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_870,(cmInstallCommandArguments *)&files.Ignore,
                             (bool)(ica.DefaultComponentName.field_2._M_local_buf[0xf] & 1));
              cmMakefile::AddInstallGenerator(pcVar1,&g->super_cmInstallGenerator);
              this_02 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
              cmInstallCommandArguments::GetComponent_abi_cxx11_
                        ((cmInstallCommandArguments *)&files.Ignore);
              pcVar9 = (char *)std::__cxx11::string::c_str();
              cmGlobalGenerator::AddInstallComponent(this_02,pcVar9);
              this_local._7_1_ = 1;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_bd0);
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,0);
              poVar5 = std::operator<<((ostream *)local_bd0,(string *)pvVar4);
              std::operator<<(poVar5," given no DESTINATION!");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_bf0);
              std::__cxx11::string::~string((string *)&local_bf0);
              this_local._7_1_ = 0;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_bd0);
            }
          }
          else {
            this_local._7_1_ = 0;
          }
        }
        else {
          this_local._7_1_ = 0;
        }
LAB_0058ca36:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_870);
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_690);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    poVar5 = std::operator<<((ostream *)local_690,(string *)pvVar4);
    poVar5 = std::operator<<(poVar5," given unknown argument \"");
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_518,0);
    poVar5 = std::operator<<(poVar5,(string *)pvVar6);
    std::operator<<(poVar5,"\".");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_6b0);
    std::__cxx11::string::~string((string *)&local_6b0);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_690);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_518);
  cmCAStringVector::~cmCAStringVector((cmCAStringVector *)local_4f0);
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)&files.Ignore);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmInstallCommand::HandleFilesMode(std::vector<std::string> const& args)
{
  // This is the FILES mode.
  bool programs = (args[0] == "PROGRAMS");
  cmInstallCommandArguments ica(this->DefaultComponentName);
  cmCAStringVector files(&ica.Parser, programs ? "PROGRAMS" : "FILES");
  files.Follows(CM_NULLPTR);
  ica.ArgumentGroup.Follows(&files);
  std::vector<std::string> unknownArgs;
  ica.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
  }

  const std::vector<std::string>& filesVector = files.GetVector();

  // Check if there is something to do.
  if (filesVector.empty()) {
    return true;
  }

  if (!ica.GetRename().empty() && filesVector.size() > 1) {
    // The rename option works only with one file.
    std::ostringstream e;
    e << args[0] << " given RENAME option with more than one file.";
    this->SetError(e.str());
    return false;
  }

  std::vector<std::string> absFiles;
  if (!this->MakeFilesFullPath(args[0].c_str(), filesVector, absFiles)) {
    return false;
  }

  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0062);

  cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
  for (std::vector<std::string>::const_iterator fileIt = filesVector.begin();
       fileIt != filesVector.end(); ++fileIt) {
    if (gg->IsExportedTargetsFile(*fileIt)) {
      const char* modal = CM_NULLPTR;
      std::ostringstream e;
      cmake::MessageType messageType = cmake::AUTHOR_WARNING;

      switch (status) {
        case cmPolicies::WARN:
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0062) << "\n";
          modal = "should";
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          modal = "may";
          messageType = cmake::FATAL_ERROR;
      }
      if (modal) {
        e << "The file\n  " << *fileIt << "\nwas generated by the export() "
                                          "command.  It "
          << modal << " not be installed with the "
                      "install() command.  Use the install(EXPORT) mechanism "
                      "instead.  See the cmake-packages(7) manual for more.\n";
        this->Makefile->IssueMessage(messageType, e.str());
        if (messageType == cmake::FATAL_ERROR) {
          return false;
        }
      }
    }
  }

  if (!ica.Finalize()) {
    return false;
  }

  if (ica.GetDestination().empty()) {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
  }

  // Create the files install generator.
  this->Makefile->AddInstallGenerator(
    CreateInstallFilesGenerator(this->Makefile, absFiles, ica, programs));

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()->AddInstallComponent(
    ica.GetComponent().c_str());

  return true;
}